

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O3

void class1(int *ip)

{
  check_eol(ip);
  loccnt = loccnt + 1;
  if (pass == 1) {
    putbyte(data_loccnt,opval);
    println();
    return;
  }
  return;
}

Assistant:

void
class1(int *ip)
{
	check_eol(ip);

	/* update location counter */
	loccnt++;

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcode */
		putbyte(data_loccnt, opval);

		/* output line */
		println();
	}
}